

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<unsigned_long> *this;
  value_type_conflict2 vVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  reference puVar6;
  ostream *poVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  uint *puVar11;
  iterator __first;
  double dVar12;
  int local_5e4;
  uint local_5e0;
  int z;
  uint32_t x_4;
  int i_1;
  uint32_t x_3;
  int i;
  size_t cnt;
  value_type local_5c0;
  undefined1 local_5b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> cntsrt;
  allocator<unsigned_int> local_589;
  undefined1 local_588 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> arr;
  size_t p_1;
  __mbstate_t local_560;
  reference local_558;
  value_type *cl_1;
  undefined1 auStack_548 [3];
  uint8_t offs_1;
  int p;
  __mbstate_t local_540;
  byte *local_538;
  uint8_t *offs;
  value_type *cl;
  size_t pool;
  undefined1 local_518 [4];
  uint32_t x_2;
  vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_> cache;
  size_t max_line;
  uint64_t mem2;
  undefined1 local_4e8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> wrt_offset;
  fstream of;
  char local_4c0 [512];
  undefined8 local_2c0;
  uint64_t mem;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets2;
  unsigned_long x_1;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  uint64_t sum;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  uint32_t x;
  undefined1 local_250 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> poolsize;
  size_t pools_count;
  size_t bits_per_pool;
  long local_218;
  ifstream f;
  
  std::ifstream::ifstream(&local_218,"input",_S_bin);
  std::operator<<((ostream *)&std::cerr,"detect pool sizes...\t");
  poolsize.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x20000;
  _x = 0;
  this = (allocator<unsigned_long> *)
         ((long)&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,0x20000,
             (value_type *)&x,this);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    std::istream::read((char *)&local_218,
                       (long)&offsets.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
    if (bVar3) {
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,
                           (ulong)((uint)offsets.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x10)
                          );
      *pvVar10 = *pvVar10 + 1;
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,0x20000);
  __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250);
  x_1 = (unsigned_long)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&x_1), bVar3) {
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    offsets2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*puVar6;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,(value_type *)&__range1
              );
    __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(__range1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start +
               (long)offsets2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage * 4);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&mem,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
  dVar12 = relClockOffset();
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,dVar12);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cerr,"write unsorted...\t");
  local_2c0 = 0x7812000;
  _Var5 = std::operator|(_S_bin,_S_out);
  _Var5 = std::operator|(_Var5,_S_in);
  _Var5 = std::operator|(_Var5,_S_trunc);
  std::fstream::fstream
            (&wrt_offset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"output",_Var5);
  mem2._7_1_ = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&mem2 + 6));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4e8,0x20000,
             (value_type_conflict1 *)((long)&mem2 + 7),(allocator<unsigned_char> *)((long)&mem2 + 6)
            );
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&mem2 + 6));
  cache.
  super__Vector_base<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xef;
  std::vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>::
  vector((vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
          *)local_518);
  std::vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>::
  resize((vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
          *)local_518,0x20000);
  std::ios::clear((long)&local_218 + *(long *)(local_218 + -0x18),0);
  std::istream::seekg((long)&local_218,_S_beg);
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    std::istream::read((char *)&local_218,(long)&pool + 4);
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
    if (bVar3) {
      cl = (value_type *)(ulong)(pool._4_4_ >> 0x10);
      offs = (uint8_t *)
             std::
             vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
             ::operator[]((vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                           *)local_518,(size_type)cl);
      local_538 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4e8,
                             (size_type)cl);
      bVar2 = *local_538;
      bVar4 = std::numeric_limits<unsigned_char>::max();
      vVar1 = pool._4_4_;
      if (bVar2 == bVar4) {
        pvVar8 = std::array<unsigned_int,_239UL>::operator[]
                           ((array<unsigned_int,_239UL> *)offs,(ulong)*local_538);
        *pvVar8 = vVar1;
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
                             (size_type)cl);
        std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_548,*pvVar10);
        std::ostream::seekp(local_4c0,_auStack_548,local_540);
        std::ostream::write(local_4c0,(long)offs);
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
                             (size_type)cl);
        *pvVar10 = *pvVar10 + 0x3bc;
        *local_538 = 0;
      }
      else {
        bVar2 = *local_538;
        *local_538 = bVar2 + 1;
        pvVar8 = std::array<unsigned_int,_239UL>::operator[]
                           ((array<unsigned_int,_239UL> *)offs,(ulong)bVar2);
        *pvVar8 = vVar1;
      }
    }
  }
  dVar12 = relClockOffset();
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,dVar12);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cerr,"write remaining pools...\t");
  for (cl_1._4_4_ = 0; cl_1._4_4_ < 0x20000; cl_1._4_4_ = cl_1._4_4_ + 1) {
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4e8,
                        (long)(int)cl_1._4_4_);
    cl_1._3_1_ = *pvVar9;
    if (cl_1._3_1_ != '\0') {
      local_558 = std::
                  vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                  ::operator[]((vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
                                *)local_518,(long)(int)cl_1._4_4_);
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
                           (long)(int)cl_1._4_4_);
      std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&p_1,*pvVar10);
      std::ostream::seekp(local_4c0,p_1,local_560);
      std::ostream::write(local_4c0,(long)local_558);
    }
  }
  std::vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>::
  ~vector((vector<std::array<unsigned_int,_239UL>,_std::allocator<std::array<unsigned_int,_239UL>_>_>
           *)local_518);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4e8);
  dVar12 = relClockOffset();
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,dVar12);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cerr,"sort separate pools...\t");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&mem);
  for (arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < (pointer)0x20000;
      arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,
                         (size_type)
                         arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
    if (*pvVar10 < 0x20000) {
      std::allocator<unsigned_int>::allocator(&local_589);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_588,0,&local_589);
      std::allocator<unsigned_int>::~allocator(&local_589);
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,
                           (size_type)
                           arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_588,*pvVar10);
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
                           (size_type)
                           arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::istream::seekg((long)&wrt_offset.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (_Ios_Seekdir)*pvVar10);
      puVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_588);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_588);
      std::istream::read((char *)&wrt_offset.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(long)puVar11);
      __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_588);
      cntsrt.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_588);
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )__first._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )cntsrt.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
                           (size_type)
                           arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::ostream::seekp((long)local_4c0,(_Ios_Seekdir)*pvVar10);
      puVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_588);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_588);
      std::ostream::write(local_4c0,(long)puVar11);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_588);
    }
    else {
      local_5c0 = 0;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&cnt + 7));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b8,0x20000,
                 &local_5c0,(allocator<unsigned_long> *)((long)&cnt + 7));
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&cnt + 7));
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
                           (size_type)
                           arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::istream::seekg((long)&wrt_offset.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (_Ios_Seekdir)*pvVar10);
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,
                           (size_type)
                           arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      _x_3 = *pvVar10;
      for (i_1 = 0; (ulong)(long)i_1 < _x_3; i_1 = i_1 + 1) {
        std::istream::read((char *)&wrt_offset.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)&x_4);
        pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b8,
                             (ulong)(x_4 & 0x1ffff));
        *pvVar10 = *pvVar10 + 1;
      }
      pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum,
                           (size_type)
                           arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::ostream::seekp((long)local_4c0,(_Ios_Seekdir)*pvVar10);
      for (z = 0; z < 0x20000; z = z + 1) {
        local_5e0 = (uint)((long)arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage << 0x10) | z;
        for (local_5e4 = 0;
            pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b8,
                                 (long)z), (ulong)(long)local_5e4 < *pvVar10;
            local_5e4 = local_5e4 + 1) {
          std::ostream::write(local_4c0,(long)&local_5e0);
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b8);
    }
  }
  dVar12 = relClockOffset();
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,dVar12);
  std::operator<<(poVar7,"\n");
  std::fstream::close();
  std::fstream::~fstream
            (&wrt_offset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&mem);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sum);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250);
  std::ifstream::~ifstream(&local_218);
  return 0;
}

Assistant:

int main(){
    ifstream f("input", std::ios::binary);

    cerr << "detect pool sizes...\t";

    const size_t bits_per_pool = 16;
    const size_t pools_count = 2<<(32-bits_per_pool);
    vector<uint64_t> poolsize(pools_count, 0);

    while(!f.eof()) {
        uint32_t x;
        f.read((char*)&x, sizeof(x));
        if(f) {
            poolsize[x >> bits_per_pool]++;
        }
    }

    vector<uint64_t> offsets;
    offsets.reserve(pools_count);

    uint64_t sum=0;
    for(auto x: poolsize) {
        offsets.push_back(sum);
        sum+= x*4;
    }

    vector<uint64_t> offsets2(offsets);

    cerr << relClockOffset() << "\n";
    cerr << "write unsorted...\t";

    const uint64_t mem = 128'000'000 -
            pools_count*8 /*poolsize*/ -
            2*pools_count*4 /*offsets*/;

    //STAGE 2

    fstream of("output", std::ios::binary | std::ios::out | std::ios::in | std::ios::trunc);

    {
        vector<uint8_t> wrt_offset(pools_count, 0);

        const uint64_t mem2 = mem - pools_count*1 /*wrt_offset*/;

        const size_t max_line = mem2/pools_count/4; //256;
        vector<array<uint32_t, max_line> > cache;
        cache.resize(pools_count);

        f.clear();
        f.seekg(0, ios::beg);

        while (!f.eof()) {
            uint32_t x;
            f.read((char *) &x, sizeof(x));
            if (f) {
                size_t pool = x >> bits_per_pool;

                auto &cl = cache[pool];
                uint8_t &offs = wrt_offset[pool];
                if (offs == numeric_limits<uint8_t>::max()) {
                    cl[offs] = x;
                    of.seekp(offsets[pool]);
                    of.write((char *) &cl, 4 * max_line);
                    offsets[pool] += 4 * max_line;
                    offs = 0;
                } else {
                    cl[offs++] = x;
                }
            }
        }

        cerr << relClockOffset() << "\n";
        cerr << "write remaining pools...\t";

        for (int p = 0; p < pools_count; p++) {
            uint8_t offs = wrt_offset[p];
            if (offs > 0) {
                auto &cl = cache[p];
                of.seekp(offsets[p]);
                of.write((char *) &cl, 4 * (offs));
            }
        }
    }

    cerr << relClockOffset() << "\n";
    cerr << "sort separate pools...\t";

    //STAGE 3

    offsets = offsets2;
//    offsets2.clear();
//    offsets2.shrink_to_fit();
//    const size_t mem3 = mem - pools_count*4 /*offsets*/;

    for(size_t p =0;p<pools_count;p++) {
        if(poolsize[p] < 2<<bits_per_pool) {
            vector<uint32_t > arr(0);
            arr.resize(poolsize[p]);
            of.seekg(offsets[p], ios::beg);
            of.read((char*)arr.data(), arr.size()*4);
            sort(arr.begin(), arr.end());
            of.seekp(offsets[p], ios::beg);
            of.write((char*)arr.data(), arr.size()*4);
        } else {
            vector<uint64_t> cntsrt(2 << bits_per_pool, 0);
            of.seekg(offsets[p], ios::beg);
            size_t cnt = poolsize[p];
            for (int i = 0; i < cnt; i++) {
                uint32_t x;
                of.read((char *) &x, 4);
                cntsrt[x & ((2<<bits_per_pool)-1) ]++;
            }
            of.seekp(offsets[p], ios::beg);
            for (int i = 0; i < 2 << bits_per_pool; i++) {
                uint32_t x = (p << bits_per_pool) | i;
                for (int z = 0; z < cntsrt[i]; z++) {
                    of.write((char *) &x, 4);
                }
            }
        }
    }

    cerr << relClockOffset() << "\n";

    of.close();
}